

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O1

bool __thiscall
avro::BufferCopyInInputStream::next(BufferCopyInInputStream *this,uint8_t **data,size_t *size)

{
  bool bVar1;
  
  if ((this->available_ == 0) && (bVar1 = fill(this), !bVar1)) {
    return false;
  }
  *data = this->next_;
  *size = this->available_;
  this->next_ = this->next_ + this->available_;
  this->byteCount_ = this->byteCount_ + this->available_;
  this->available_ = 0;
  return true;
}

Assistant:

bool next(const uint8_t** data, size_t *size) {
        if (available_ == 0 && ! fill()) {
            return false;
        }
        *data = next_;
        *size = available_;
        next_ += available_;
        byteCount_ += available_;
        available_ = 0;
        return true;
    }